

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

bool __thiscall QCoreApplicationPrivate::canQuitAutomatically(QCoreApplicationPrivate *this)

{
  if (this->in_exec == true) {
    return (this->quitLockRef).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0;
  }
  return false;
}

Assistant:

bool QCoreApplicationPrivate::canQuitAutomatically()
{
    if (!in_exec)
        return false;

    // The automatic quit functionality is triggered by
    // both QEventLoopLocker and maybeLastWindowClosed.
    // In either case, we don't want to quit if there
    // are active QEventLoopLockers, even if quitLockEnabled
    // is not enabled, as the property signals whether to
    // trigger the automatic quit, not whether to block it.
    if (quitLockRef.loadRelaxed())
        return false;

    return true;
}